

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

void __thiscall Company::changeBoss(Company *this)

{
  Boss *pBVar1;
  long lVar2;
  int iVar3;
  Employee *this_00;
  long lVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = Employee::efficiency(&this->boss->super_Employee);
  if (dVar5 < 40.0) {
    this_00 = maxEfficiency(this);
    lVar2 = 0;
    while( true ) {
      lVar4 = lVar2;
      iVar3 = Boss::getNumberOfEmployees(this->boss);
      if (iVar3 <= lVar4) break;
      dVar5 = Employee::efficiency(this->employees[lVar4]);
      dVar6 = Employee::efficiency(this_00);
      lVar2 = lVar4 + 1;
      if ((dVar5 == dVar6) && (!NAN(dVar5) && !NAN(dVar6))) {
        iVar3 = Boss::getNumberOfEmployees(this->boss);
        pBVar1 = this->boss;
        this->boss = (Boss *)this->employees[lVar4];
        this->employees[lVar4] = &pBVar1->super_Employee;
        Boss::setNumberOfEmployees(this->boss,iVar3);
        return;
      }
    }
  }
  return;
}

Assistant:

void Company::changeBoss() {

    if (boss->efficiency() < 40.0) {
        Employee *max = maxEfficiency(); // get the max efficiency
        for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
            if (employees[i]->efficiency() == max->efficiency()) {
                int numberOfEmployee = boss->getNumberOfEmployees();
                Employee *temp = boss; // store the value of boss
                boss = static_cast<Boss *>(employees[i]); // assign the max efficiency employee to boss with casting
                employees[i] = temp; // assign the boss which we stored earlier to that employee
                boss->setNumberOfEmployees(numberOfEmployee); // set the number of employees for the new boss
                break;
            }
        }
    }
}